

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_tree(archive_write *a,isoent **isoentpp)

{
  extr_rec *peVar1;
  long lVar2;
  isofile *piVar3;
  isofile *piVar4;
  int iVar5;
  mode_t mVar6;
  mode_t mVar7;
  char *pcVar8;
  char *pcVar9;
  long *in_RSI;
  isoent *in_RDI;
  archive_string as;
  isoent *vp;
  int l;
  char *p;
  char *fn;
  isofile *f2;
  isofile *f1;
  isoent *np;
  isoent *isoent;
  isoent *dent;
  iso9660_conflict *iso9660;
  char name [256];
  undefined7 in_stack_fffffffffffffe58;
  char in_stack_fffffffffffffe5f;
  isoent *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  void *in_stack_fffffffffffffe70;
  archive_rb_tree *in_stack_fffffffffffffe78;
  iso9660_conflict *iso9660_00;
  archive_write *a_00;
  int local_15c;
  char *local_150;
  isoent *local_138;
  isoent *local_128;
  int local_4;
  
  peVar1 = (in_RDI->extr_rec_list).first;
  lVar2 = *in_RSI;
  local_128 = *(isoent **)(peVar1->buf + 0xb0);
  if (*(long *)(*(long *)(lVar2 + 0x18) + 0x30) == 0) {
    local_150 = "";
  }
  else {
    local_150 = *(char **)(*(long *)(lVar2 + 0x18) + 0x28);
  }
  if ((*(long *)(peVar1->buf + 0x20) == *(long *)(*(long *)(lVar2 + 0x18) + 0x30)) &&
     (iVar5 = strcmp(*(char **)(peVar1->buf + 0x18),local_150), iVar5 == 0)) {
    iVar5 = isoent_add_child_tail
                      ((isoent *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                       (isoent *)0x175632);
    if (iVar5 != 0) {
      return 0;
    }
    local_138 = (isoent *)
                __archive_rb_tree_find_node(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  }
  else {
    while (local_15c = get_path_component((char *)in_stack_fffffffffffffe78,
                                          (size_t)in_stack_fffffffffffffe70,
                                          (char *)CONCAT44(in_stack_fffffffffffffe6c,
                                                           in_stack_fffffffffffffe68)),
          local_15c != 0) {
      if (local_15c < 0) {
        archive_set_error((archive *)in_RDI,-1,"A name buffer is too small");
        _isoent_free(in_stack_fffffffffffffe60);
        return -0x1e;
      }
      local_138 = isoent_find_child(in_stack_fffffffffffffe60,
                                    (char *)CONCAT17(in_stack_fffffffffffffe5f,
                                                     in_stack_fffffffffffffe58));
      if ((local_138 == (isoent *)0x0) || (*local_150 == '\0')) goto LAB_001757ee;
      if (-1 < (char)(local_138->field_0xe8 << 6)) {
        pcVar9 = archive_entry_pathname
                           ((archive_entry *)
                            CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        pcVar8 = archive_entry_pathname
                           ((archive_entry *)
                            CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        archive_set_error((archive *)in_RDI,-1,"`%s\' is not directory, we cannot insert `%s\' ",
                          pcVar9,pcVar8);
        _isoent_free(in_stack_fffffffffffffe60);
        *in_RSI = 0;
        return -0x19;
      }
      local_150 = local_150 + local_15c;
      local_128 = local_138;
      if (*local_150 == '/') {
        local_150 = local_150 + 1;
      }
    }
    local_138 = (isoent *)0x0;
LAB_001757ee:
    if (local_138 == (isoent *)0x0) {
      while (*local_150 != '\0') {
        iso9660_00 = (iso9660_conflict *)0x0;
        a_00 = (archive_write *)0x0;
        archive_strncat((archive_string *)0x0,in_stack_fffffffffffffe78,
                        (size_t)in_stack_fffffffffffffe70);
        if (((undefined1 *)((long)&a_00[-1].format_free + 7))[(long)&iso9660_00->birth_time] == '/')
        {
          ((undefined1 *)((long)&a_00[-1].format_free + 7))[(long)&iso9660_00->birth_time] = 0;
          a_00 = (archive_write *)((long)&a_00[-1].format_free + 7);
        }
        local_128 = isoent_create_virtual_dir(a_00,iso9660_00,(char *)in_stack_fffffffffffffe78);
        if (local_128 == (isoent *)0x0) {
          archive_string_free((archive_string *)0x1758b6);
          archive_set_error((archive *)in_RDI,0xc,"Can\'t allocate memory");
          _isoent_free(in_stack_fffffffffffffe60);
          *in_RSI = 0;
          return -0x1e;
        }
        archive_string_free((archive_string *)0x175904);
        if (*(int *)(peVar1->buf + 0x2d0) < local_128->file->dircnt) {
          *(int *)(peVar1->buf + 0x2d0) = local_128->file->dircnt;
        }
        isoent_add_child_tail
                  ((isoent *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                   (isoent *)0x175952);
        local_150 = local_150 + local_15c;
        if (*local_150 == '/') {
          local_150 = local_150 + 1;
        }
        local_15c = get_path_component((char *)in_stack_fffffffffffffe78,
                                       (size_t)in_stack_fffffffffffffe70,
                                       (char *)CONCAT44(in_stack_fffffffffffffe6c,
                                                        in_stack_fffffffffffffe68));
        if (local_15c < 0) {
          archive_string_free((archive_string *)0x1759b7);
          archive_set_error((archive *)in_RDI,-1,"A name buffer is too small");
          _isoent_free(in_stack_fffffffffffffe60);
          *in_RSI = 0;
          return -0x1e;
        }
      }
      *(isoent **)(peVar1->buf + 0x10) = local_128;
      peVar1->buf[0x20] = '\0';
      peVar1->buf[0x21] = '\0';
      peVar1->buf[0x22] = '\0';
      peVar1->buf[0x23] = '\0';
      peVar1->buf[0x24] = '\0';
      peVar1->buf[0x25] = '\0';
      peVar1->buf[0x26] = '\0';
      peVar1->buf[0x27] = '\0';
      archive_string_ensure
                ((archive_string *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                 (size_t)in_stack_fffffffffffffe60);
      if ((local_128->file->parentdir).length + (local_128->file->basename).length == 0) {
        **(undefined1 **)(peVar1->buf + 0x18) = 0;
      }
      else {
        if ((local_128->file->parentdir).length != 0) {
          peVar1->buf[0x20] = '\0';
          peVar1->buf[0x21] = '\0';
          peVar1->buf[0x22] = '\0';
          peVar1->buf[0x23] = '\0';
          peVar1->buf[0x24] = '\0';
          peVar1->buf[0x25] = '\0';
          peVar1->buf[0x26] = '\0';
          peVar1->buf[0x27] = '\0';
          archive_string_concat
                    ((archive_string *)in_stack_fffffffffffffe60,
                     (archive_string *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58)
                    );
          archive_strappend_char
                    ((archive_string *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f);
        }
        archive_string_concat
                  ((archive_string *)in_stack_fffffffffffffe60,
                   (archive_string *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
      }
      iVar5 = isoent_add_child_tail
                        ((isoent *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                         (isoent *)0x175b2a);
      if (iVar5 != 0) {
        return 0;
      }
      local_138 = (isoent *)
                  __archive_rb_tree_find_node(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    }
  }
  piVar3 = local_138->file;
  piVar4 = *(isofile **)(lVar2 + 0x18);
  mVar6 = archive_entry_filetype(piVar3->entry);
  mVar7 = archive_entry_filetype(piVar4->entry);
  if (mVar6 == mVar7) {
    local_138->file = piVar4;
    *(isofile **)(lVar2 + 0x18) = piVar3;
    local_138->field_0xe8 = local_138->field_0xe8 & 0xfe;
    _isoent_free(in_stack_fffffffffffffe60);
    *in_RSI = (long)local_138;
    local_4 = 0;
  }
  else {
    pcVar9 = archive_entry_pathname
                       ((archive_entry *)
                        CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    archive_set_error((archive *)in_RDI,-1,
                      "Found duplicate entries `%s\' and its file type is different",pcVar9);
    _isoent_free(in_RDI);
    *in_RSI = 0;
    local_4 = -0x19;
  }
  return local_4;
}

Assistant:

static int
isoent_tree(struct archive_write *a, struct isoent **isoentpp)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	char name[_MAX_FNAME];/* Included null terminator size. */
#elif defined(NAME_MAX) && NAME_MAX >= 255
	char name[NAME_MAX+1];
#else
	char name[256];
#endif
	struct iso9660 *iso9660 = a->format_data;
	struct isoent *dent, *isoent, *np;
	struct isofile *f1, *f2;
	const char *fn, *p;
	int l;

	isoent = *isoentpp;
	dent = iso9660->primary.rootent;
	if (isoent->file->parentdir.length > 0)
		fn = p = isoent->file->parentdir.s;
	else
		fn = p = "";

	/*
	 * If the path of the parent directory of `isoent' entry is
	 * the same as the path of `cur_dirent', add isoent to
	 * `cur_dirent'.
	 */
	if (archive_strlen(&(iso9660->cur_dirstr))
	      == archive_strlen(&(isoent->file->parentdir)) &&
	    strcmp(iso9660->cur_dirstr.s, fn) == 0) {
		if (!isoent_add_child_tail(iso9660->cur_dirent, isoent)) {
			np = (struct isoent *)__archive_rb_tree_find_node(
			    &(iso9660->cur_dirent->rbtree),
			    isoent->file->basename.s);
			goto same_entry;
		}
		return (ARCHIVE_OK);
	}

	for (;;) {
		l = get_path_component(name, sizeof(name), fn);
		if (l == 0) {
			np = NULL;
			break;
		}
		if (l < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "A name buffer is too small");
			_isoent_free(isoent);
			return (ARCHIVE_FATAL);
		}

		np = isoent_find_child(dent, name);
		if (np == NULL || fn[0] == '\0')
			break;

		/* Find next subdirectory. */
		if (!np->dir) {
			/* NOT Directory! */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "`%s' is not directory, we cannot insert `%s' ",
			    archive_entry_pathname(np->file->entry),
			    archive_entry_pathname(isoent->file->entry));
			_isoent_free(isoent);
			*isoentpp = NULL;
			return (ARCHIVE_FAILED);
		}
		fn += l;
		if (fn[0] == '/')
			fn++;
		dent = np;
	}
	if (np == NULL) {
		/*
		 * Create virtual parent directories.
		 */
		while (fn[0] != '\0') {
			struct isoent *vp;
			struct archive_string as;

			archive_string_init(&as);
			archive_strncat(&as, p, fn - p + l);
			if (as.s[as.length-1] == '/') {
				as.s[as.length-1] = '\0';
				as.length--;
			}
			vp = isoent_create_virtual_dir(a, iso9660, as.s);
			if (vp == NULL) {
				archive_string_free(&as);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory");
				_isoent_free(isoent);
				*isoentpp = NULL;
				return (ARCHIVE_FATAL);
			}
			archive_string_free(&as);

			if (vp->file->dircnt > iso9660->dircnt_max)
				iso9660->dircnt_max = vp->file->dircnt;
			isoent_add_child_tail(dent, vp);
			np = vp;

			fn += l;
			if (fn[0] == '/')
				fn++;
			l = get_path_component(name, sizeof(name), fn);
			if (l < 0) {
				archive_string_free(&as);
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "A name buffer is too small");
				_isoent_free(isoent);
				*isoentpp = NULL;
				return (ARCHIVE_FATAL);
			}
			dent = np;
		}

		/* Found out the parent directory where isoent can be
		 * inserted. */
		iso9660->cur_dirent = dent;
		archive_string_empty(&(iso9660->cur_dirstr));
		archive_string_ensure(&(iso9660->cur_dirstr),
		    archive_strlen(&(dent->file->parentdir)) +
		    archive_strlen(&(dent->file->basename)) + 2);
		if (archive_strlen(&(dent->file->parentdir)) +
		    archive_strlen(&(dent->file->basename)) == 0)
			iso9660->cur_dirstr.s[0] = 0;
		else {
			if (archive_strlen(&(dent->file->parentdir)) > 0) {
				archive_string_copy(&(iso9660->cur_dirstr),
				    &(dent->file->parentdir));
				archive_strappend_char(&(iso9660->cur_dirstr), '/');
			}
			archive_string_concat(&(iso9660->cur_dirstr),
			    &(dent->file->basename));
		}

		if (!isoent_add_child_tail(dent, isoent)) {
			np = (struct isoent *)__archive_rb_tree_find_node(
			    &(dent->rbtree), isoent->file->basename.s);
			goto same_entry;
		}
		return (ARCHIVE_OK);
	}

same_entry:
	/*
	 * We have already has the entry the filename of which is
	 * the same.
	 */
	f1 = np->file;
	f2 = isoent->file;

	/* If the file type of entries is different,
	 * we cannot handle it. */
	if (archive_entry_filetype(f1->entry) !=
	    archive_entry_filetype(f2->entry)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Found duplicate entries `%s' and its file type is "
		    "different",
		    archive_entry_pathname(f1->entry));
		_isoent_free(isoent);
		*isoentpp = NULL;
		return (ARCHIVE_FAILED);
	}

	/* Swap file entries. */
	np->file = f2;
	isoent->file = f1;
	np->virtual = 0;

	_isoent_free(isoent);
	*isoentpp = np;
	return (ARCHIVE_OK);
}